

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pager_write(PgHdr *pPg)

{
  Pager *pPager;
  u8 *aData;
  sqlite3_file *psVar1;
  sqlite3_vfs *psVar2;
  int iVar3;
  u32 val;
  uint uVar4;
  uint uVar5;
  Bitvec *pBVar6;
  MemJournal *p;
  long lVar7;
  
  pPager = pPg->pPager;
  if (pPager->errCode != 0) {
    return pPager->errCode;
  }
  if (pPager->readOnly != '\0') {
    return 3;
  }
  aData = (u8 *)pPg->pData;
  if (pPager->eState == '\x02') {
    if ((pPager->pWal == (Wal *)0x0) && (pPager->journalMode != '\x02')) {
      psVar2 = pPager->pVfs;
      pBVar6 = sqlite3BitvecCreate(pPager->dbSize);
      pPager->pInJournal = pBVar6;
      if (pBVar6 == (Bitvec *)0x0) {
        return 7;
      }
      psVar1 = pPager->jfd;
      if (psVar1->pMethods == (sqlite3_io_methods *)0x0) {
        if (pPager->journalMode == '\x04') {
          psVar1[5].pMethods = (sqlite3_io_methods *)0x0;
          psVar1[3].pMethods = (sqlite3_io_methods *)0x0;
          psVar1[4].pMethods = (sqlite3_io_methods *)0x0;
          psVar1[1].pMethods = (sqlite3_io_methods *)0x0;
          psVar1[2].pMethods = (sqlite3_io_methods *)0x0;
          psVar1->pMethods = &MemJournalMethods;
        }
        else {
          iVar3 = 0x100e;
          if (pPager->tempFile == '\0') {
            iVar3 = 0x806;
          }
          iVar3 = (*psVar2->xOpen)(psVar2,pPager->zJournal,psVar1,iVar3,(int *)0x0);
          if (iVar3 != 0) goto LAB_00148e3c;
        }
      }
      pPager->nRec = 0;
      pPager->setMaster = '\0';
      pPager->journalOff = 0;
      pPager->journalHdr = 0;
      iVar3 = writeJournalHdr(pPager);
      if (iVar3 != 0) {
LAB_00148e3c:
        sqlite3BitvecDestroy(pPager->pInJournal);
        pPager->pInJournal = (Bitvec *)0x0;
        return iVar3;
      }
    }
    pPager->eState = '\x03';
  }
  sqlite3PcacheMakeDirty(pPg);
  iVar3 = pageInJournal(pPg);
  if (iVar3 == 0) {
    if (pPager->pWal == (Wal *)0x0) {
      uVar4 = pPg->pgno;
      if ((pPager->dbOrigSize < uVar4) ||
         (psVar1 = pPager->jfd, psVar1->pMethods == (sqlite3_io_methods *)0x0)) {
        if (pPager->eState != '\x04') {
          *(byte *)&pPg->flags = (byte)pPg->flags | 4;
        }
      }
      else {
        lVar7 = pPager->journalOff;
        val = pager_cksum(pPager,aData);
        *(byte *)&pPg->flags = (byte)pPg->flags | 4;
        iVar3 = write32bits(psVar1,lVar7,uVar4);
        if (iVar3 != 0) {
          return iVar3;
        }
        lVar7 = lVar7 + 4;
        iVar3 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,aData,pPager->pageSize,lVar7);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = write32bits(pPager->jfd,lVar7 + pPager->pageSize,val);
        if (iVar3 != 0) {
          return iVar3;
        }
        pPager->journalOff = (long)pPager->pageSize + pPager->journalOff + 8;
        pPager->nRec = pPager->nRec + 1;
        uVar4 = sqlite3BitvecSet(pPager->pInJournal,pPg->pgno);
        uVar5 = addToSavepointBitvecs(pPager,pPg->pgno);
        if ((uVar5 | uVar4) != 0) {
          return uVar5 | uVar4;
        }
      }
    }
LAB_00148cd4:
    iVar3 = subjRequiresPage(pPg);
    if (iVar3 != 0) {
      iVar3 = subjournalPage(pPg);
      goto LAB_00148cee;
    }
  }
  else {
    iVar3 = subjRequiresPage(pPg);
    if (iVar3 != 0) goto LAB_00148cd4;
  }
  iVar3 = 0;
LAB_00148cee:
  if (pPager->dbSize < pPg->pgno) {
    pPager->dbSize = pPg->pgno;
  }
  return iVar3;
}

Assistant:

static int pager_write(PgHdr *pPg){
  void *pData = pPg->pData;
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;

  /* This routine is not called unless a write-transaction has already 
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );

  /* If an error has been previously detected, report the same error
  ** again. This should not happen, but the check provides robustness. */
  if( NEVER(pPager->errCode) )  return pPager->errCode;

  /* Higher-level routines never call this function if database is not
  ** writable.  But check anyway, just for robustness. */
  if( NEVER(pPager->readOnly) ) return SQLITE_PERM;

  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page. 
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page as dirty.  If the page has already been written
  ** to the journal then we can return right away.
  */
  sqlite3PcacheMakeDirty(pPg);
  if( pageInJournal(pPg) && !subjRequiresPage(pPg) ){
    assert( !pagerUseWal(pPager) );
  }else{
  
    /* The transaction journal now exists and we have a RESERVED or an
    ** EXCLUSIVE lock on the main database file.  Write the current page to
    ** the transaction journal if it is not there already.
    */
    if( !pageInJournal(pPg) && !pagerUseWal(pPager) ){
      assert( pagerUseWal(pPager)==0 );
      if( pPg->pgno<=pPager->dbOrigSize && isOpen(pPager->jfd) ){
        u32 cksum;
        char *pData2;
        i64 iOff = pPager->journalOff;

        /* We should never write to the journal file the page that
        ** contains the database locks.  The following assert verifies
        ** that we do not. */
        assert( pPg->pgno!=PAGER_MJ_PGNO(pPager) );

        assert( pPager->journalHdr<=pPager->journalOff );
        CODEC2(pPager, pData, pPg->pgno, 7, return SQLITE_NOMEM, pData2);
        cksum = pager_cksum(pPager, (u8*)pData2);

        /* Even if an IO or diskfull error occurs while journalling the
        ** page in the block above, set the need-sync flag for the page.
        ** Otherwise, when the transaction is rolled back, the logic in
        ** playback_one_page() will think that the page needs to be restored
        ** in the database file. And if an IO error occurs while doing so,
        ** then corruption may follow.
        */
        pPg->flags |= PGHDR_NEED_SYNC;

        rc = write32bits(pPager->jfd, iOff, pPg->pgno);
        if( rc!=SQLITE_OK ) return rc;
        rc = sqlite3OsWrite(pPager->jfd, pData2, pPager->pageSize, iOff+4);
        if( rc!=SQLITE_OK ) return rc;
        rc = write32bits(pPager->jfd, iOff+pPager->pageSize+4, cksum);
        if( rc!=SQLITE_OK ) return rc;

        IOTRACE(("JOUT %p %d %lld %d\n", pPager, pPg->pgno, 
                 pPager->journalOff, pPager->pageSize));
        PAGER_INCR(sqlite3_pager_writej_count);
        PAGERTRACE(("JOURNAL %d page %d needSync=%d hash(%08x)\n",
             PAGERID(pPager), pPg->pgno, 
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0), pager_pagehash(pPg)));

        pPager->journalOff += 8 + pPager->pageSize;
        pPager->nRec++;
        assert( pPager->pInJournal!=0 );
        rc = sqlite3BitvecSet(pPager->pInJournal, pPg->pgno);
        testcase( rc==SQLITE_NOMEM );
        assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
        rc |= addToSavepointBitvecs(pPager, pPg->pgno);
        if( rc!=SQLITE_OK ){
          assert( rc==SQLITE_NOMEM );
          return rc;
        }
      }else{
        if( pPager->eState!=PAGER_WRITER_DBMOD ){
          pPg->flags |= PGHDR_NEED_SYNC;
        }
        PAGERTRACE(("APPEND %d page %d needSync=%d\n",
                PAGERID(pPager), pPg->pgno,
               ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
      }
    }
  
    /* If the statement journal is open and the page is not in it,
    ** then write the current page to the statement journal.  Note that
    ** the statement journal format differs from the standard journal format
    ** in that it omits the checksums and the header.
    */
    if( subjRequiresPage(pPg) ){
      rc = subjournalPage(pPg);
    }
  }

  /* Update the database size and return.
  */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}